

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonmax.c
# Opt level: O1

xy * aom_nonmax_suppression
               (xy *corners,int *scores,int num_corners,int **ret_scores,int *ret_num_nonmax)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  xy *__ptr;
  xy *pxVar9;
  void *__s;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int x;
  ulong uVar17;
  
  uVar17 = (ulong)(uint)num_corners;
  *ret_scores = (int *)0x0;
  *ret_num_nonmax = -1;
  if ((scores == (int *)0x0 || corners == (xy *)0x0) || num_corners < 1) {
    *ret_num_nonmax = 0;
  }
  else {
    __ptr = (xy *)malloc(uVar17 * 8);
    if (__ptr != (xy *)0x0) {
      pxVar9 = (xy *)malloc(uVar17 * 4);
      if (pxVar9 != (xy *)0x0) {
        uVar3 = corners[num_corners - 1U].y;
        __s = malloc((long)(int)uVar3 * 4 + 4);
        if (__s != (void *)0x0) {
          if (-1 < (int)uVar3) {
            memset(__s,0xff,(ulong)uVar3 * 4 + 4);
          }
          if (0 < num_corners) {
            iVar12 = -1;
            uVar10 = 0;
            do {
              iVar4 = corners[uVar10].y;
              if (iVar4 != iVar12) {
                *(int *)((long)__s + (long)iVar4 * 4) = (int)uVar10;
                iVar12 = iVar4;
              }
              uVar10 = uVar10 + 1;
            } while (uVar17 != uVar10);
          }
          if (num_corners < 1) {
            iVar12 = 0;
          }
          else {
            uVar11 = 0;
            iVar12 = 0;
            uVar10 = 0;
            uVar14 = 0;
            do {
              iVar4 = scores[uVar11];
              iVar5 = corners[uVar11].x;
              iVar6 = corners[uVar11].y;
              if (((((uVar11 == 0) || (corners[uVar11 - 1].x != iVar5 + -1)) ||
                   (corners[uVar11 - 1].y != iVar6)) || (scores[uVar11 - 1] < iVar4)) &&
                 ((((long)(int)(num_corners - 1U) <= (long)uVar11 ||
                   (corners[uVar11 + 1].x != iVar5 + 1)) ||
                  ((corners[uVar11 + 1].y != iVar6 || (scores[uVar11 + 1] < iVar4)))))) {
                if (0 < iVar6) {
                  uVar7 = *(uint *)((long)__s + (ulong)(iVar6 - 1U) * 4);
                  if (uVar7 != 0xffffffff) {
                    uVar13 = uVar10 & 0xffffffff;
                    if (corners[(int)uVar10].y < (int)(iVar6 - 1U)) {
                      uVar13 = (ulong)uVar7;
                    }
                    uVar10 = uVar13;
                    if (corners[(int)uVar13].y < iVar6) {
                      uVar13 = (long)(int)uVar13;
                      do {
                        uVar10 = uVar13;
                        if (iVar5 + -1 <= corners[uVar13].x) break;
                        uVar10 = uVar13 + 1;
                        lVar16 = uVar13 + 1;
                        uVar13 = uVar10;
                      } while (corners[lVar16].y < iVar6);
                    }
                    if (corners[(int)uVar10].y < iVar6) {
                      iVar1 = iVar5 + 1;
                      lVar16 = (long)(int)uVar10 << 2;
                      do {
                        iVar8 = *(int *)((long)&corners->x + lVar16 * 2);
                        if (iVar8 != iVar1 && iVar1 <= iVar8) break;
                        if ((((iVar8 == iVar1) || (iVar8 == iVar5 + -1)) || (iVar8 == iVar5)) &&
                           (iVar4 <= *(int *)((long)scores + lVar16))) goto LAB_003c7217;
                        lVar2 = lVar16 * 2;
                        lVar16 = lVar16 + 4;
                      } while (*(int *)((long)&corners[1].y + lVar2) < iVar6);
                    }
                  }
                }
                if (((iVar6 < (int)uVar3) &&
                    (uVar7 = *(uint *)((long)__s + (long)iVar6 * 4 + 4), uVar7 != 0xffffffff)) &&
                   ((int)uVar14 < num_corners)) {
                  if (iVar6 < corners[(int)uVar14].y) {
                    uVar7 = uVar14;
                  }
                  uVar13 = (ulong)uVar7;
                  if ((int)uVar7 < num_corners) {
                    uVar15 = (ulong)(int)uVar7;
                    do {
                      uVar13 = uVar15;
                      if ((corners[uVar15].y != iVar6 + 1) || (iVar5 + -1 <= corners[uVar15].x))
                      break;
                      uVar15 = uVar15 + 1;
                      uVar13 = uVar17;
                    } while (uVar17 != uVar15);
                  }
                  uVar14 = (uint)uVar13;
                  if ((int)uVar14 < num_corners) {
                    iVar1 = iVar5 + 1;
                    lVar16 = 0;
                    do {
                      if (corners[(int)uVar14 + lVar16].y != iVar6 + 1) break;
                      iVar8 = corners[(int)uVar14 + lVar16].x;
                      if (iVar8 != iVar1 && iVar1 <= iVar8) break;
                      if ((((iVar8 == iVar1) || (iVar8 == iVar5 + -1)) || (iVar8 == iVar5)) &&
                         (iVar4 <= scores[(int)uVar14 + lVar16])) goto LAB_003c7217;
                      lVar16 = lVar16 + 1;
                    } while (num_corners - uVar14 != (int)lVar16);
                  }
                }
                __ptr[iVar12] = corners[uVar11];
                (&pxVar9->x)[iVar12] = iVar4;
                iVar12 = iVar12 + 1;
              }
LAB_003c7217:
              uVar11 = uVar11 + 1;
            } while (uVar11 != uVar17);
          }
          free(__s);
          *ret_scores = (int *)pxVar9;
          *ret_num_nonmax = iVar12;
          return __ptr;
        }
        free(__ptr);
        __ptr = pxVar9;
      }
      free(__ptr);
    }
  }
  return (xy *)0x0;
}

Assistant:

xy* aom_nonmax_suppression(const xy* corners, const int* scores, int num_corners,
                           int** ret_scores, int* ret_num_nonmax)
{
  int num_nonmax=0;
  int last_row;
  int* row_start;
  int i, j;
  xy* ret_nonmax;
  int* nonmax_scores;
  const int sz = (int)num_corners;

  /*Point above points (roughly) to the pixel above the one of interest, if there
    is a feature there.*/
  int point_above = 0;
  int point_below = 0;

  *ret_scores = 0;
  *ret_num_nonmax = -1;
  if(!(corners && scores) || num_corners < 1)
  {
    *ret_num_nonmax = 0;
    return 0;
  }

  ret_nonmax = (xy*)malloc(num_corners * sizeof(xy));
  if(!ret_nonmax)
  {
    return 0;
  }

  nonmax_scores = (int*)malloc(num_corners * sizeof(*nonmax_scores));
  if (!nonmax_scores)
  {
    free(ret_nonmax);
    return 0;
  }

  /* Find where each row begins
     (the corners are output in raster scan order). A beginning of -1 signifies
     that there are no corners on that row. */
  last_row = corners[num_corners-1].y;
  row_start = (int*)malloc((last_row+1)*sizeof(int));
  if(!row_start)
  {
    free(ret_nonmax);
    free(nonmax_scores);
    return 0;
  }

  for(i=0; i < last_row+1; i++)
    row_start[i] = -1;

  {
    int prev_row = -1;
    for(i=0; i< num_corners; i++)
      if(corners[i].y != prev_row)
      {
        row_start[corners[i].y] = i;
        prev_row = corners[i].y;
      }
  }



  for(i=0; i < sz; i++)
  {
    int score = scores[i];
    xy pos = corners[i];
    assert(pos.y <= last_row);

    /*Check left */
    if(i > 0)
      if(corners[i-1].x == pos.x-1 && corners[i-1].y == pos.y && Compare(scores[i-1], score))
        continue;

    /*Check right*/
    if(i < (sz - 1))
      if(corners[i+1].x == pos.x+1 && corners[i+1].y == pos.y && Compare(scores[i+1], score))
        continue;

    /*Check above (if there is a valid row above)*/
    if(pos.y > 0 && row_start[pos.y - 1] != -1)
    {
      /*Make sure that current point_above is one
        row above.*/
      if(corners[point_above].y < pos.y - 1)
        point_above = row_start[pos.y-1];

      /*Make point_above point to the first of the pixels above the current point,
        if it exists.*/
      for(; corners[point_above].y < pos.y && corners[point_above].x < pos.x - 1; point_above++)
      {}


      for(j=point_above; corners[j].y < pos.y && corners[j].x <= pos.x + 1; j++)
      {
        int x = corners[j].x;
        if( (x == pos.x - 1 || x ==pos.x || x == pos.x+1) && Compare(scores[j], score))
          goto cont;
      }

    }

    /*Check below (if there is anything below)*/
    if (pos.y + 1 < last_row+1 && row_start[pos.y + 1] != -1 && point_below < sz) /*Nothing below*/
    {
      if(corners[point_below].y < pos.y + 1)
        point_below = row_start[pos.y+1];

      /* Make point below point to one of the pixels belowthe current point, if it
         exists.*/
      for(; point_below < sz && corners[point_below].y == pos.y+1 && corners[point_below].x < pos.x - 1; point_below++)
      {}

      for(j=point_below; j < sz && corners[j].y == pos.y+1 && corners[j].x <= pos.x + 1; j++)
      {
        int x = corners[j].x;
        if( (x == pos.x - 1 || x ==pos.x || x == pos.x+1) && Compare(scores[j],score))
          goto cont;
      }
    }

    ret_nonmax[num_nonmax] = corners[i];
    nonmax_scores[num_nonmax] = scores[i];
    num_nonmax++;
cont:
    ;
  }

  free(row_start);
  *ret_scores = nonmax_scores;
  *ret_num_nonmax = num_nonmax;
  return ret_nonmax;
}